

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::tree_node<char,_true>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<char,true,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_true>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  int *piVar1;
  atomic<unsigned_int> *paVar2;
  internal_node<char,_true> *p_node;
  rrb_size_table<true> *prVar3;
  uint32_t *puVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  ref<immutable::rrb_details::internal_node<char,_true>_> rVar7;
  undefined4 *__ptr;
  internal_node<char,_true> *p_node_00;
  rrb_size_table<true> *prVar8;
  internal_node<char,_true> *piVar9;
  rrb_size_table<true> *__ptr_00;
  ulong uVar10;
  uint32_t uVar11;
  char *__function;
  uint uVar12;
  atomic<unsigned_int> *paVar13;
  long lVar14;
  tree_node<char,_true> *ptVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ref<immutable::rrb_details::tree_node<char,_true>_> left_hand_node;
  ref<immutable::rrb_details::internal_node<char,_true>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_true>_> child;
  ref<immutable::rrb_details::tree_node<char,_true>_> local_70;
  uint32_t local_64;
  rrb_size_table<true> *local_60;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_58;
  tree_node<char,_true> *local_50;
  ref<immutable::rrb_details::tree_node<char,_true>_> local_48;
  rrb_size_table<true> *local_40;
  uint32_t *local_38;
  
  bVar5 = (byte)shift;
  uVar17 = left >> (bVar5 & 0x1f);
  p_node = (internal_node<char,_true> *)root->ptr;
  if (shift == 0) {
    if (p_node != (internal_node<char,_true> *)0x0) {
      LOCK();
      (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      uVar11 = p_node->len;
      uVar16 = (ulong)(uVar11 - uVar17);
      __ptr = (undefined4 *)malloc(uVar16 + 0x18);
      __ptr[1] = uVar11 - uVar17;
      *__ptr = 0;
      *(undefined4 **)(__ptr + 4) = __ptr + 6;
      __ptr[3] = 0;
      if (uVar11 - uVar17 == 0) {
        LOCK();
        __ptr[2] = 1;
        UNLOCK();
      }
      else {
        uVar10 = 0;
        do {
          *(undefined1 *)(*(long *)(__ptr + 4) + uVar10) = 0;
          uVar10 = uVar10 + 1;
        } while (uVar16 != uVar10);
        LOCK();
        __ptr[2] = 1;
        UNLOCK();
        if (uVar11 != uVar17) {
          uVar10 = 0;
          do {
            *(undefined1 *)(*(long *)(__ptr + 4) + uVar10) =
                 *(undefined1 *)
                  ((long)&((p_node->size_table).ptr)->size + (ulong)(uVar17 + (int)uVar10));
            uVar10 = uVar10 + 1;
          } while (uVar16 != uVar10);
        }
      }
      *total_shift = 0;
      *(undefined4 **)this = __ptr;
      LOCK();
      piVar1 = __ptr + 2;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      paVar13 = &p_node->_ref_count;
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(__ptr);
      }
      LOCK();
      (paVar13->super___atomic_base<unsigned_int>)._M_i =
           (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar13->super___atomic_base<unsigned_int>)._M_i != 0) {
        return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
      }
      free(p_node);
      return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<char, true>>::operator->() const [T = immutable::rrb_details::leaf_node<char, true>]"
    ;
    goto LAB_00133bbf;
  }
  if (p_node != (internal_node<char,_true> *)0x0) {
    LOCK();
    (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    prVar3 = (p_node->size_table).ptr;
    if (prVar3 == (rrb_size_table<true> *)0x0) {
      uVar11 = left - (uVar17 << (bVar5 & 0x1f));
    }
    else {
      puVar4 = prVar3->size;
      uVar16 = (ulong)(uVar17 - 1);
      do {
        uVar10 = uVar16;
        uVar17 = (int)uVar10 + 1;
        uVar16 = (ulong)uVar17;
      } while (puVar4[uVar17] <= left);
      if (uVar17 == 0) {
        uVar17 = 0;
        uVar11 = left;
      }
      else {
        uVar11 = left - puVar4[uVar10];
      }
    }
    uVar12 = p_node->len - 1;
    local_48.ptr = (tree_node<char,_true> *)p_node->child[uVar17].ptr;
    if ((internal_node<char,_true> *)local_48.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      (((internal_node<char,_true> *)local_48.ptr)->_ref_count).super___atomic_base<unsigned_int>.
      _M_i = (((internal_node<char,_true> *)local_48.ptr)->_ref_count).
             super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    local_50 = (tree_node<char,_true> *)this;
    rrb_drop_left_rec<char,true,5>
              ((rrb_details *)&local_70,total_shift,&local_48,uVar11,shift - 5,
               uVar17 != uVar12 || has_right);
    if (uVar17 != uVar12) {
      local_64 = p_node->len;
      uVar18 = local_64 - uVar17;
      uVar16 = (ulong)uVar18;
      local_38 = total_shift;
      piVar9 = (internal_node<char,_true> *)malloc(uVar16 * 8 + 0x20);
      piVar9->len = uVar18;
      piVar9->type = INTERNAL_NODE;
      (piVar9->size_table).ptr = (rrb_size_table<true> *)0x0;
      piVar9->guid = 0;
      piVar9->child = (ref<immutable::rrb_details::internal_node<char,_true>_> *)(piVar9 + 1);
      lVar14 = 0;
      memset(piVar9 + 1,0,uVar16 * 8);
      LOCK();
      (piVar9->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      uVar12 = uVar17;
      for (; uVar12 = uVar12 + 1, (ulong)(uVar18 - 1) << 3 != lVar14; lVar14 = lVar14 + 8) {
        ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                   ((long)&piVar9->child[1].ptr + lVar14),p_node->child + uVar12);
      }
      prVar3 = (p_node->size_table).ptr;
      if (prVar3 != (rrb_size_table<true> *)0x0) {
        LOCK();
        (prVar3->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (prVar3->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      __ptr_00 = (rrb_size_table<true> *)malloc(uVar16 * 4 + 0x10);
      prVar8 = __ptr_00 + 1;
      __ptr_00->size = (uint32_t *)prVar8;
      __ptr_00->guid = 0;
      LOCK();
      (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      auVar6 = _DAT_00153110;
      UNLOCK();
      local_60 = prVar3;
      local_40 = __ptr_00;
      if (prVar3 == (rrb_size_table<true> *)0x0) {
        if (local_64 != uVar17) {
          lVar14 = uVar16 - 1;
          auVar19._8_4_ = (int)lVar14;
          auVar19._0_8_ = lVar14;
          auVar19._12_4_ = (int)((ulong)lVar14 >> 0x20);
          uVar10 = 0;
          auVar19 = auVar19 ^ _DAT_00153110;
          auVar20 = _DAT_00153100;
          do {
            auVar21 = auVar20 ^ auVar6;
            if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                        auVar19._4_4_ < auVar21._4_4_) & 1)) {
              *(uint *)((long)&__ptr_00[1].size + uVar10 * 4) =
                   uVar17 + 1 + (int)uVar10 << (bVar5 & 0x1f);
            }
            if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
                auVar21._12_4_ <= auVar19._12_4_) {
              *(uint *)((long)&__ptr_00[1].size + uVar10 * 4 + 4) =
                   uVar17 + 2 + (int)uVar10 << (bVar5 & 0x1f);
            }
            uVar10 = uVar10 + 2;
            lVar14 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 2;
            auVar20._8_8_ = lVar14 + 2;
          } while ((uVar16 + 1 & 0xfffffffffffffffe) != uVar10);
        }
      }
      else {
        memcpy(prVar8,prVar3->size + uVar17,uVar16 * 4);
      }
      prVar3 = local_40;
      if (local_64 != uVar17) {
        uVar10 = 0;
        do {
          piVar1 = (int *)((long)&prVar8->size + uVar10 * 4);
          *piVar1 = *piVar1 - left;
          uVar10 = uVar10 + 1;
        } while (uVar16 != uVar10);
      }
      LOCK();
      (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      prVar8 = (piVar9->size_table).ptr;
      (piVar9->size_table).ptr = __ptr_00;
      if (prVar8 != (rrb_size_table<true> *)0x0) {
        LOCK();
        paVar13 = &prVar8->_ref_count;
        (paVar13->super___atomic_base<unsigned_int>)._M_i =
             (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar13->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(prVar8);
        }
      }
      paVar13 = &prVar3->_ref_count;
      ref<immutable::rrb_details::internal_node<char,true>>::operator=
                ((ref<immutable::rrb_details::internal_node<char,true>> *)piVar9->child,&local_70);
      ptVar15 = local_50;
      *local_38 = shift;
      *(internal_node<char,_true> **)local_50 = piVar9;
      LOCK();
      (piVar9->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (piVar9->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      LOCK();
      (paVar13->super___atomic_base<unsigned_int>)._M_i =
           (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar13->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(__ptr_00);
      }
      if (local_60 != (rrb_size_table<true> *)0x0) {
        LOCK();
        paVar13 = &local_60->_ref_count;
        (paVar13->super___atomic_base<unsigned_int>)._M_i =
             (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar13->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(local_60);
        }
      }
      release<char>(piVar9);
      goto LAB_00133b65;
    }
    if (!has_right) {
      *(tree_node<char,_true> **)local_50 = local_70.ptr;
      ptVar15 = local_50;
      if ((internal_node<char,_true> *)local_70.ptr != (internal_node<char,_true> *)0x0) {
        LOCK();
        ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00133b65;
    }
    p_node_00 = (internal_node<char,_true> *)malloc(0x28);
    p_node_00->type = INTERNAL_NODE;
    p_node_00->len = 1;
    (p_node_00->size_table).ptr = (rrb_size_table<true> *)0x0;
    p_node_00->guid = 0;
    piVar9 = p_node_00 + 1;
    p_node_00->child = (ref<immutable::rrb_details::internal_node<char,_true>_> *)piVar9;
    p_node_00[1].type = LEAF_NODE;
    p_node_00[1].len = 0;
    LOCK();
    (p_node_00->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    local_58.ptr = (internal_node<char,_true> *)local_70.ptr;
    if ((internal_node<char,_true> *)local_70.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      piVar9 = (internal_node<char,_true> *)p_node_00->child;
    }
    ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<char,_true>_> *)piVar9,&local_58);
    rVar7.ptr = local_58.ptr;
    if (shift - 5 != 0) {
      if (local_58.ptr == (internal_node<char,_true> *)0x0) goto LAB_00133b93;
      prVar3 = ((local_58.ptr)->size_table).ptr;
      if (prVar3 != (rrb_size_table<true> *)0x0) {
        prVar8 = (rrb_size_table<true> *)malloc(0x14);
        prVar8->size = (uint32_t *)(prVar8 + 1);
        prVar8->guid = 0;
        LOCK();
        (prVar8->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        *(uint32_t *)&prVar8[1].size = prVar3->size[(rVar7.ptr)->len - 1];
        LOCK();
        (prVar8->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (prVar8->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        paVar13 = &prVar8->_ref_count;
        prVar3 = (p_node_00->size_table).ptr;
        (p_node_00->size_table).ptr = prVar8;
        if (prVar3 != (rrb_size_table<true> *)0x0) {
          LOCK();
          paVar2 = &prVar3->_ref_count;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(prVar3);
          }
        }
        LOCK();
        (paVar13->super___atomic_base<unsigned_int>)._M_i =
             (paVar13->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar13->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(prVar8);
        }
      }
    }
    ptVar15 = local_50;
    *total_shift = shift;
    *(internal_node<char,_true> **)local_50 = p_node_00;
    LOCK();
    (p_node_00->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (p_node_00->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    release<char>(local_58.ptr);
    release<char>(p_node_00);
LAB_00133b65:
    ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&local_70);
    ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&local_48);
    release<char>(p_node);
    return (ref<immutable::rrb_details::tree_node<char,_true>_>)ptVar15;
  }
LAB_00133b93:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<char, true>>::operator->() const [T = immutable::rrb_details::internal_node<char, true>]"
  ;
LAB_00133bbf:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }